

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::SetShadingPropertiesCommon
          (FBXConverter *this,aiMaterial *out_mat,PropertyTable *props)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Property *pPVar3;
  long lVar4;
  char *pcVar5;
  PropertyTable *pPVar6;
  float *pInput;
  float CalculatedOpacity;
  float DispFactor;
  float BumpFactor;
  float ReflectionFactor;
  float Opacity;
  float TransparencyFactor;
  float ShininessExponent;
  float SpecularFactor;
  char local_cd;
  float local_cc;
  string local_c8;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  undefined1 local_88 [36];
  undefined1 local_64 [8];
  float local_5c;
  undefined1 local_58 [24];
  undefined1 local_40 [24];
  
  paVar1 = &local_c8.field_2;
  pcVar5 = "Diffuse";
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Diffuse","");
  GetColorPropertyFromMaterial
            ((FBXConverter *)(local_40 + 0xc),(PropertyTable *)pcVar5,(string *)props,
             (bool *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_cd == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,local_40 + 0xc,0xc,"$clr.diffuse",0,0,aiPTI_Float);
  }
  pcVar5 = "Emissive";
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Emissive","");
  GetColorPropertyFromMaterial
            ((FBXConverter *)local_40,(PropertyTable *)pcVar5,(string *)props,(bool *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_cd == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,local_40,0xc,"$clr.emissive",0,0,aiPTI_Float);
  }
  pPVar6 = (PropertyTable *)0x75c51f;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Ambient","");
  GetColorPropertyFromMaterial
            ((FBXConverter *)(local_58 + 0xc),pPVar6,(string *)props,(bool *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_cd == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,local_58 + 0xc,0xc,"$clr.ambient",0,0,aiPTI_Float);
  }
  pPVar6 = (PropertyTable *)0x778583;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"SpecularColor","");
  GetColorProperty((FBXConverter *)local_58,pPVar6,(string *)props,(bool *)&local_c8,
                   SUB81(&local_cd,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_cd == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,local_58,0xc,"$clr.specular",0,0,aiPTI_Float);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"SpecularFactor","");
  pPVar3 = PropertyTable::Get(props,&local_c8);
  if (pPVar3 == (Property *)0x0) {
    pPVar6 = (props->templateProps).
             super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_cc = 0.0;
    if (pPVar6 != (PropertyTable *)0x0) {
      pPVar3 = PropertyTable::Get(pPVar6,&local_c8);
      if (pPVar3 != (Property *)0x0) goto LAB_005a04d5;
      local_cd = '\0';
    }
LAB_005a053d:
    bVar2 = false;
  }
  else {
LAB_005a04d5:
    lVar4 = __dynamic_cast(pPVar3,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
    if (lVar4 == 0) {
      local_cd = '\0';
      local_cc = 0.0;
      goto LAB_005a053d;
    }
    local_cd = '\x01';
    local_cc = *(float *)(lVar4 + 8);
    bVar2 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_8c = local_cc;
  if (bVar2) {
    aiMaterial::AddBinaryProperty(out_mat,&local_8c,4,"$mat.shinpercent",0,0,aiPTI_Float);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"ShininessExponent","");
  pPVar3 = PropertyTable::Get(props,&local_c8);
  if (pPVar3 == (Property *)0x0) {
LAB_005a05e6:
    local_cd = '\0';
    local_90 = 0.0;
    bVar2 = false;
  }
  else {
    lVar4 = __dynamic_cast(pPVar3,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
    if (lVar4 == 0) goto LAB_005a05e6;
    local_cd = '\x01';
    local_90 = *(float *)(lVar4 + 8);
    bVar2 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    local_cc = local_90;
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    local_90 = local_cc;
  }
  if (bVar2) {
    aiMaterial::AddBinaryProperty(out_mat,&local_90,4,"$mat.shininess",0,0,aiPTI_Float);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"TransparentColor","");
  pcVar5 = "TransparencyFactor";
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"TransparencyFactor","");
  GetColorPropertyFactored
            ((FBXConverter *)local_64,(PropertyTable *)pcVar5,(string *)props,&local_c8,
             (bool *)local_88,SUB81(&local_cd,0));
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_a8 = 1.0;
  if (local_cd == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,local_64,0xc,"$clr.transparent",0,0,aiPTI_Float);
    local_a8 = ((float)local_64._0_4_ + (float)local_64._4_4_ + local_5c) / -3.0 + 1.0;
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"TransparencyFactor","");
  pPVar3 = PropertyTable::Get(props,&local_c8);
  local_94 = 0.0;
  if (pPVar3 == (Property *)0x0) {
    bVar2 = false;
  }
  else {
    lVar4 = __dynamic_cast(pPVar3,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
    if (lVar4 == 0) {
      local_cd = '\0';
      bVar2 = false;
      local_94 = 0.0;
    }
    else {
      local_cd = '\x01';
      local_94 = *(float *)(lVar4 + 8);
      bVar2 = true;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    local_cc = local_94;
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    local_94 = local_cc;
  }
  if (bVar2) {
    aiMaterial::AddBinaryProperty(out_mat,&local_94,4,"$mat.transparencyfactor",0,0,aiPTI_Float);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Opacity","");
  pPVar3 = PropertyTable::Get(props,&local_c8);
  if (pPVar3 == (Property *)0x0) {
LAB_005a0847:
    local_cd = '\0';
    local_98 = 0.0;
    bVar2 = false;
  }
  else {
    lVar4 = __dynamic_cast(pPVar3,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
    if (lVar4 == 0) goto LAB_005a0847;
    local_cd = '\x01';
    local_98 = *(float *)(lVar4 + 8);
    bVar2 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    local_cc = local_98;
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    local_98 = local_cc;
  }
  if (bVar2) {
    pInput = &local_98;
LAB_005a089c:
    aiMaterial::AddBinaryProperty(out_mat,pInput,4,"$mat.opacity",0,0,aiPTI_Float);
  }
  else if ((local_a8 != 1.0) || (NAN(local_a8))) {
    pInput = &local_a8;
    goto LAB_005a089c;
  }
  pcVar5 = "ReflectionColor";
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"ReflectionColor","");
  GetColorProperty((FBXConverter *)local_88,(PropertyTable *)pcVar5,(string *)props,
                   (bool *)&local_c8,SUB81(&local_cd,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_cd == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,local_88,0xc,"$clr.reflective",0,0,aiPTI_Float);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"ReflectionFactor","");
  pPVar3 = PropertyTable::Get(props,&local_c8);
  if (pPVar3 == (Property *)0x0) {
    pPVar6 = (props->templateProps).
             super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_cc = 0.0;
    if (pPVar6 != (PropertyTable *)0x0) {
      pPVar3 = PropertyTable::Get(pPVar6,&local_c8);
      if (pPVar3 != (Property *)0x0) goto LAB_005a0966;
    }
    bVar2 = false;
  }
  else {
LAB_005a0966:
    bVar2 = false;
    lVar4 = __dynamic_cast(pPVar3,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
    if (lVar4 == 0) {
      local_cc = 0.0;
    }
    else {
      local_cc = *(float *)(lVar4 + 8);
      bVar2 = true;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_9c = local_cc;
  if (bVar2) {
    aiMaterial::AddBinaryProperty(out_mat,&local_9c,4,"$mat.reflectivity",0,0,aiPTI_Float);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"BumpFactor","");
  pPVar3 = PropertyTable::Get(props,&local_c8);
  local_a0 = 0.0;
  if (pPVar3 == (Property *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    lVar4 = __dynamic_cast(pPVar3,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
    if (lVar4 == 0) {
      local_a0 = 0.0;
    }
    else {
      local_a0 = *(float *)(lVar4 + 8);
      bVar2 = true;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    local_cc = local_a0;
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    local_a0 = local_cc;
  }
  if (bVar2) {
    aiMaterial::AddBinaryProperty(out_mat,&local_a0,4,"$mat.bumpscaling",0,0,aiPTI_Float);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"DisplacementFactor","");
  pPVar3 = PropertyTable::Get(props,&local_c8);
  local_a4 = 0.0;
  if (pPVar3 == (Property *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    lVar4 = __dynamic_cast(pPVar3,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
    if (lVar4 == 0) {
      local_a4 = 0.0;
    }
    else {
      local_a4 = *(float *)(lVar4 + 8);
      bVar2 = true;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    local_cc = local_a4;
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    local_a4 = local_cc;
  }
  if (bVar2) {
    aiMaterial::AddBinaryProperty(out_mat,&local_a4,4,"$mat.displacementscaling",0,0,aiPTI_Float);
  }
  return;
}

Assistant:

void FBXConverter::SetShadingPropertiesCommon(aiMaterial* out_mat, const PropertyTable& props)
        {
            // Set shading properties.
            // Modern FBX Files have two separate systems for defining these,
            // with only the more comprehensive one described in the property template.
            // Likely the other values are a legacy system,
            // which is still always exported by the official FBX SDK.
            //
            // Blender's FBX import and export mostly ignore this legacy system,
            // and as we only support recent versions of FBX anyway, we can do the same.
            bool ok;

            const aiColor3D& Diffuse = GetColorPropertyFromMaterial(props, "Diffuse", ok);
            if (ok) {
                out_mat->AddProperty(&Diffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
            }

            const aiColor3D& Emissive = GetColorPropertyFromMaterial(props, "Emissive", ok);
            if (ok) {
                out_mat->AddProperty(&Emissive, 1, AI_MATKEY_COLOR_EMISSIVE);
            }

            const aiColor3D& Ambient = GetColorPropertyFromMaterial(props, "Ambient", ok);
            if (ok) {
                out_mat->AddProperty(&Ambient, 1, AI_MATKEY_COLOR_AMBIENT);
            }

            // we store specular factor as SHININESS_STRENGTH, so just get the color
            const aiColor3D& Specular = GetColorProperty(props, "SpecularColor", ok, true);
            if (ok) {
                out_mat->AddProperty(&Specular, 1, AI_MATKEY_COLOR_SPECULAR);
            }

            // and also try to get SHININESS_STRENGTH
            const float SpecularFactor = PropertyGet<float>(props, "SpecularFactor", ok, true);
            if (ok) {
                out_mat->AddProperty(&SpecularFactor, 1, AI_MATKEY_SHININESS_STRENGTH);
            }

            // and the specular exponent
            const float ShininessExponent = PropertyGet<float>(props, "ShininessExponent", ok);
            if (ok) {
                out_mat->AddProperty(&ShininessExponent, 1, AI_MATKEY_SHININESS);
            }

            // TransparentColor / TransparencyFactor... gee thanks FBX :rolleyes:
            const aiColor3D& Transparent = GetColorPropertyFactored(props, "TransparentColor", "TransparencyFactor", ok);
            float CalculatedOpacity = 1.0f;
            if (ok) {
                out_mat->AddProperty(&Transparent, 1, AI_MATKEY_COLOR_TRANSPARENT);
                // as calculated by FBX SDK 2017:
                CalculatedOpacity = 1.0f - ((Transparent.r + Transparent.g + Transparent.b) / 3.0f);
            }

            // try to get the transparency factor
            const float TransparencyFactor = PropertyGet<float>(props, "TransparencyFactor", ok);
            if (ok) {
                out_mat->AddProperty(&TransparencyFactor, 1, AI_MATKEY_TRANSPARENCYFACTOR);
            }

            // use of TransparencyFactor is inconsistent.
            // Maya always stores it as 1.0,
            // so we can't use it to set AI_MATKEY_OPACITY.
            // Blender is more sensible and stores it as the alpha value.
            // However both the FBX SDK and Blender always write an additional
            // legacy "Opacity" field, so we can try to use that.
            //
            // If we can't find it,
            // we can fall back to the value which the FBX SDK calculates
            // from transparency colour (RGB) and factor (F) as
            // 1.0 - F*((R+G+B)/3).
            //
            // There's no consistent way to interpret this opacity value,
            // so it's up to clients to do the correct thing.
            const float Opacity = PropertyGet<float>(props, "Opacity", ok);
            if (ok) {
                out_mat->AddProperty(&Opacity, 1, AI_MATKEY_OPACITY);
            }
            else if (CalculatedOpacity != 1.0) {
                out_mat->AddProperty(&CalculatedOpacity, 1, AI_MATKEY_OPACITY);
            }

            // reflection color and factor are stored separately
            const aiColor3D& Reflection = GetColorProperty(props, "ReflectionColor", ok, true);
            if (ok) {
                out_mat->AddProperty(&Reflection, 1, AI_MATKEY_COLOR_REFLECTIVE);
            }

            float ReflectionFactor = PropertyGet<float>(props, "ReflectionFactor", ok, true);
            if (ok) {
                out_mat->AddProperty(&ReflectionFactor, 1, AI_MATKEY_REFLECTIVITY);
            }

            const float BumpFactor = PropertyGet<float>(props, "BumpFactor", ok);
            if (ok) {
                out_mat->AddProperty(&BumpFactor, 1, AI_MATKEY_BUMPSCALING);
            }

            const float DispFactor = PropertyGet<float>(props, "DisplacementFactor", ok);
            if (ok) {
                out_mat->AddProperty(&DispFactor, 1, "$mat.displacementscaling", 0, 0);
    }
}